

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

int __thiscall QSslSocket::close(QSslSocket *this,int __fd)

{
  long lVar1;
  QAbstractSocket *this_00;
  int iVar2;
  long lVar3;
  
  lVar1 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (*(long **)(lVar1 + 0x408) != (long *)0x0) {
    (**(code **)(**(long **)(lVar1 + 0x408) + 0xb0))();
  }
  if (*(char *)(lVar1 + 0x192) != '\0') goto LAB_0024c727;
  lVar3 = *(long *)&(this->super_QTcpSocket).super_QAbstractSocket.field_0x8;
  if (*(int *)(lVar3 + 0x270) == 0) {
LAB_0024c70c:
    if ((*(long *)(lVar1 + 0x98) == 0) || (*(long *)(*(long *)(lVar1 + 0x98) + 0x18) == 0))
    goto LAB_0024c727;
  }
  else {
    lVar3 = (**(code **)(**(long **)(lVar3 + 0x3f8) + 0xa8))();
    if (lVar3 == 0) goto LAB_0024c70c;
  }
  QAbstractSocket::flush((QAbstractSocket *)this);
LAB_0024c727:
  this_00 = *(QAbstractSocket **)(lVar1 + 0x3f8);
  if (this_00 != (QAbstractSocket *)0x0) {
    if (*(char *)(lVar1 + 0x192) == '\x01') {
      QAbstractSocket::abort(this_00);
    }
    else {
      (**(code **)(*(long *)this_00 + 0x70))();
    }
  }
  iVar2 = QAbstractSocket::close((QAbstractSocket *)this,__fd);
  if (*(long *)(lVar1 + 0x90) != 0) {
    iVar2 = QRingBuffer::clear();
  }
  if (*(long *)(lVar1 + 0x98) != 0) {
    iVar2 = QRingBuffer::clear();
    return iVar2;
  }
  return iVar2;
}

Assistant:

void QSslSocket::close()
{
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::close()";
#endif
    Q_D(QSslSocket);

    // On Windows, CertGetCertificateChain is probably still doing its
    // job, if the socket is re-used, we want to ignore its reported
    // root CA.
    if (auto *backend = d->backend.get())
        backend->cancelCAFetch();

    if (!d->abortCalled && (encryptedBytesToWrite() || !d->writeBuffer.isEmpty()))
        flush();
    if (d->plainSocket) {
        if (d->abortCalled)
            d->plainSocket->abort();
        else
            d->plainSocket->close();
    }
    QTcpSocket::close();

    // must be cleared, reading/writing not possible on closed socket:
    d->buffer.clear();
    d->writeBuffer.clear();
}